

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O1

void __thiscall Js::InterpreterHaltState::SetCurrentOffset(InterpreterHaltState *this,int offset)

{
  JavascriptExceptionObject *pJVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  FunctionBody *pFVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  
  if (this->topFrame != (DiagStackFrame *)0x0) {
    pFVar5 = DiagStackFrame::GetFunction(this->topFrame);
    if (this->executingFunction == (FunctionBody *)0x0 || pFVar5 == this->executingFunction)
    goto LAB_008d2714;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                              ,0x2a,"(IsValid())","IsValid()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar6 = 0;
LAB_008d2714:
  iVar4 = (*this->topFrame->_vptr_DiagStackFrame[0xc])();
  if ((char)iVar4 != '\0') {
    iVar4 = (*this->topFrame->_vptr_DiagStackFrame[0xd])();
    ByteCodeReader::SetCurrentOffset((ByteCodeReader *)CONCAT44(extraout_var,iVar4),offset);
    return;
  }
  pJVar1 = this->exceptionObject;
  if ((pJVar1 != (JavascriptExceptionObject *)0x0) && ((pJVar1->field_0x14 & 4) != 0)) {
    pJVar1->byteCodeOffsetAfterDebuggerSkip = offset;
  }
  return;
}

Assistant:

void InterpreterHaltState::SetCurrentOffset(int offset)
    {
        Assert(IsValid());
        if (this->topFrame->IsInterpreterFrame())
        {
            // For interpreter frames, actual scenarios we need changed offset are: set next in topmost frame, ignore exception.
            // For throw exception we don't need it, but it doesn't hurt because interpreter will ignore the offset
            // and rather just throw the exception.
            this->topFrame->AsInterpreterFrame()->GetReader()->SetCurrentOffset(offset);
        }
        else
        {
            // For native frames, the only scenario we need to record changed offset is when we ignore exception.
            if (this->exceptionObject && this->exceptionObject->IsDebuggerSkip())
            {
                this->exceptionObject->SetByteCodeOffsetAfterDebuggerSkip(offset);
            }
        }
    }